

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.h
# Opt level: O1

void __thiscall Alg::Alg(Alg *this,Graph *graph,TResult *tRes)

{
  this->__numRRsets = 0;
  this->__is_inf_cost = false;
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  HyperGraph::HyperGraph(&this->__hyperG,graph);
  HyperGraph::HyperGraph(&this->__hyperGVldt,graph);
  this->__tRes = tRes;
  (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->__numV = (this->__hyperG).__numV;
  this->__numE = (this->__hyperG).__numE;
  return;
}

Assistant:

Alg(const Graph& graph, TResult& tRes) : __hyperG(graph), __hyperGVldt(graph), __tRes(tRes)
    {
        __numV = __hyperG.get_nodes();
        __numE = __hyperG.get_edges();
    }